

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_quiver(void)

{
  _Bool _Var1;
  wchar_t local_14;
  object *poStack_10;
  wchar_t ret;
  object *obj;
  
  poStack_10 = (object *)0x0;
  local_14 = L'\x03';
  if (player->upkeep->quiver_cnt == L'\0') {
    msg("You have nothing in your quiver.");
  }
  else {
    player->upkeep->command_wrk = L'\b';
    while (local_14 == L'\x03') {
      screen_save();
      _Var1 = get_item(&stack0xfffffffffffffff0,"Select Item:",
                       "Error in do_cmd_quiver(), please report.",CMD_NULL,(item_tester)0x0,L'Ɵ');
      if (_Var1) {
        screen_load();
        if ((poStack_10 != (object *)0x0) && (poStack_10->kind != (object_kind *)0x0)) {
          track_object(player->upkeep,poStack_10);
          _Var1 = player_is_shapechanged(player);
          if (!_Var1) {
            do {
              local_14 = context_menu_object(poStack_10);
            } while (local_14 == L'\x02');
          }
          player->upkeep->command_wrk = L'\b';
        }
      }
      else {
        screen_load();
        local_14 = L'\xffffffff';
      }
    }
  }
  return;
}

Assistant:

void do_cmd_quiver(void)
{
	struct object *obj = NULL;
	int ret = 3;

	if (player->upkeep->quiver_cnt == 0) {
		msg("You have nothing in your quiver.");
		return;
	}

	/* Start in "quiver" mode */
	player->upkeep->command_wrk = (USE_QUIVER);

	/* Loop this menu until an object context menu says differently */
	while (ret == 3) {
		/* Save screen */
		screen_save();

		/* Get an item to use a context command on (Display the quiver) */
		if (get_item(&obj, "Select Item:",
				"Error in do_cmd_quiver(), please report.",
				CMD_NULL, NULL, GET_ITEM_PARAMS)) {
			/* Load screen */
			screen_load();

			if (obj && obj->kind) {
				/* Track the object */
				track_object(player->upkeep, obj);

				if (!player_is_shapechanged(player)) {
					while  ((ret = context_menu_object(obj)) == 2);
				}

				/* Stay in "quiver" mode */
				player->upkeep->command_wrk = (USE_QUIVER);
			}
		} else {
			/* Load screen */
			screen_load();

			ret = -1;
		}
	}
}